

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

LY_ERR lyxml_next_attribute
                 (lyxml_ctx *xmlctx,char **prefix,size_t *prefix_len,char **name,size_t *name_len)

{
  ly_in *plVar1;
  ly_ctx *ctx;
  LY_ERR LVar2;
  uint uVar3;
  byte *pbVar4;
  byte bVar5;
  int iVar6;
  undefined1 auVar7 [16];
  ly_bool dynamic;
  ly_bool ws_only;
  char *in;
  uint32_t c;
  size_t parsed;
  char *value;
  size_t value_len;
  ly_bool local_5a;
  ly_bool local_59;
  byte *local_58;
  uint local_4c;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  do {
    plVar1 = xmlctx->in;
    pbVar4 = (byte *)plVar1->current;
    bVar5 = *pbVar4;
    if (bVar5 < 0xd) {
      if (bVar5 != 9) {
        if (bVar5 != 10) break;
        plVar1->line = plVar1->line + 1;
      }
    }
    else if ((bVar5 != 0xd) && (bVar5 != 0x20)) break;
    ly_in_skip(plVar1,1);
  } while( true );
LAB_001a18db:
  LVar2 = LY_SUCCESS;
  if ((bVar5 != 0x2f) && (bVar5 != 0x3e)) {
    local_58 = pbVar4;
    if (*pbVar4 == 0) {
      ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
LAB_001a1950:
      LVar2 = LY_EVALID;
    }
    else {
      LVar2 = ly_getutf8((char **)&local_58,&local_4c,&local_48);
      if (LVar2 != LY_SUCCESS) {
LAB_001a18f4:
        ctx = xmlctx->ctx;
        uVar3 = LY_VCODE_INSTREXP_len((char *)(local_58 + -local_48));
        ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
                (ulong)uVar3,(long)local_58 - local_48,
                "element tag end (\'>\' or \'/>\') or an attribute");
        goto LAB_001a1950;
      }
      uVar3 = (local_4c & 0xffffffdf) - 0x41;
      if ((0x19 < uVar3 && local_4c != 0x5f) && (local_4c == 0x37e || 0x1c8f < local_4c - 0x370)) {
        auVar7._0_4_ = -(uint)(-0x7ffffee1 < (int)(local_4c - 0x2070 ^ 0x80000000));
        auVar7._4_4_ = -(uint)(-0x7ffffc11 < (int)(local_4c - 0x2c00 ^ 0x80000000));
        auVar7._8_4_ = -(uint)(-0x7fff5802 < (int)(local_4c - 0x3001 ^ 0x80000000));
        auVar7._12_4_ = -(uint)(-0x7ffffb31 < (int)(local_4c - 0xf900 ^ 0x80000000));
        iVar6 = movmskps(CONCAT31((int3)(uVar3 >> 8),local_4c != 0x37e),auVar7);
        if (((iVar6 == 0xf) &&
            (((0x20d < local_4c - 0xfdf0 && (0xdffff < local_4c - 0x10000)) &&
             ((local_4c & 0xfffffffe) != 0x200c)))) &&
           (0x23f < local_4c - 0xc0 || (local_4c & 0xffffffdf) == 0xd7)) goto LAB_001a18f4;
      }
      LVar2 = lyxml_parse_qname(xmlctx,prefix,prefix_len,name,name_len);
      if (LVar2 == LY_SUCCESS) {
        if (*prefix == (char *)0x0) {
LAB_001a1858:
          iVar6 = ly_strncmp("xmlns",*name,*name_len);
          if (iVar6 != 0) {
            return LY_SUCCESS;
          }
        }
        else {
          iVar6 = ly_strncmp("xmlns",*prefix,*prefix_len);
          if (iVar6 != 0) {
            if (*prefix != (char *)0x0) {
              return LY_SUCCESS;
            }
            goto LAB_001a1858;
          }
        }
        LVar2 = lyxml_next_attr_content(xmlctx,&local_40,&local_38,&local_59,&local_5a);
        if (LVar2 == LY_SUCCESS) {
          if (local_5a != '\0') {
            free(local_40);
          }
          do {
            plVar1 = xmlctx->in;
            pbVar4 = (byte *)plVar1->current;
            bVar5 = *pbVar4;
            if (bVar5 < 0xd) {
              if (bVar5 != 9) {
                if (bVar5 != 10) goto LAB_001a18db;
                plVar1->line = plVar1->line + 1;
              }
            }
            else if ((bVar5 != 0xd) && (bVar5 != 0x20)) goto LAB_001a18db;
            ly_in_skip(plVar1,1);
          } while( true );
        }
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyxml_next_attribute(struct lyxml_ctx *xmlctx, const char **prefix, size_t *prefix_len, const char **name, size_t *name_len)
{
    const char *in;
    char *value;
    uint32_t c;
    size_t parsed, value_len;
    ly_bool ws_only, dynamic;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* parse only possible attributes */
    while ((xmlctx->in->current[0] != '>') && (xmlctx->in->current[0] != '/')) {
        in = xmlctx->in->current;
        if (in[0] == '\0') {
            LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
            return LY_EVALID;
        } else if ((ly_getutf8(&in, &c, &parsed) || !is_xmlqnamestartchar(c))) {
            LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(in - parsed), in - parsed,
                    "element tag end ('>' or '/>') or an attribute");
            return LY_EVALID;
        }

        /* parse attribute name */
        LY_CHECK_RET(lyxml_parse_qname(xmlctx, prefix, prefix_len, name, name_len));

        if ((!*prefix || ly_strncmp("xmlns", *prefix, *prefix_len)) && (*prefix || ly_strncmp("xmlns", *name, *name_len))) {
            /* standard attribute */
            break;
        }

        /* namespace, skip it */
        LY_CHECK_RET(lyxml_next_attr_content(xmlctx, (const char **)&value, &value_len, &ws_only, &dynamic));
        if (dynamic) {
            free(value);
        }

        /* skip WS */
        ign_xmlws(xmlctx);
    }

    return LY_SUCCESS;
}